

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.h
# Opt level: O1

void __thiscall
QIconModeViewBase::setPositionForIndex(QIconModeViewBase *this,QPoint *position,QModelIndex *index)

{
  QSize QVar1;
  
  if ((long)index->r < (this->items).d.size) {
    QVar1 = (this->super_QCommonListViewBase).contentsSize;
    QAbstractItemView::update((QAbstractItemView *)(this->super_QCommonListViewBase).qq,index);
    moveItem(this,index->r,position);
    QAbstractItemView::update((QAbstractItemView *)(this->super_QCommonListViewBase).qq,index);
    if (((this->super_QCommonListViewBase).contentsSize.wd.m_i != QVar1.wd.m_i.m_i) ||
       ((this->super_QCommonListViewBase).contentsSize.ht.m_i != QVar1.ht.m_i.m_i)) {
      (**(code **)(**(long **)&(((this->super_QCommonListViewBase).dd)->
                               super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                               super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x268))();
      return;
    }
  }
  return;
}

Assistant:

constexpr inline int row() const noexcept { return r; }